

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O0

uint __thiscall crnlib::symbol_codec::decode_golomb(symbol_codec *this,uint m)

{
  uint uVar1;
  int in_ESI;
  undefined8 in_RDI;
  uint r;
  uint l;
  uint k;
  uint q;
  undefined4 in_stack_ffffffffffffffe0;
  uint in_stack_ffffffffffffffe4;
  uint in_stack_ffffffffffffffe8;
  uint in_stack_ffffffffffffffec;
  int iVar2;
  
  iVar2 = 0;
  do {
    in_stack_ffffffffffffffec =
         decode_peek_bits((symbol_codec *)
                          CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
                          in_stack_ffffffffffffffe4);
    in_stack_ffffffffffffffe8 =
         utils::count_leading_zeros16((in_stack_ffffffffffffffec ^ 0xffffffff) & 0xffff);
    iVar2 = in_stack_ffffffffffffffe8 + iVar2;
  } while (0xf < in_stack_ffffffffffffffe8);
  decode_remove_bits((symbol_codec *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                     (uint)((ulong)in_RDI >> 0x20));
  uVar1 = decode_truncated_binary((symbol_codec *)CONCAT44(in_ESI,iVar2),in_stack_ffffffffffffffec);
  return iVar2 * in_ESI + uVar1;
}

Assistant:

uint symbol_codec::decode_golomb(uint m) {
  CRNLIB_ASSERT(m > 1);

  uint q = 0;

  for (;;) {
    uint k = decode_peek_bits(16);

    uint l = utils::count_leading_zeros16((~k) & 0xFFFF);
    q += l;
    if (l < 16)
      break;
  }

  decode_remove_bits(q + 1);

  uint r = decode_truncated_binary(m);

  return (q * m) + r;
}